

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::session_impl::on_dht_request
          (session_impl *this,string_view query,msg *request,entry *response)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  int iVar4;
  pointer psVar5;
  shared_ptr<libtorrent::plugin> *ext;
  
  psVar1 = (this->m_ses_extensions)._M_elems[3].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar3 = (this->m_ses_extensions)._M_elems[3].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    psVar5 = psVar3;
    if (psVar5 == psVar1) break;
    peVar2 = (psVar5->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar4 = (*peVar2->_vptr_plugin[6])
                      (peVar2,query._M_len,query._M_str,&request->addr,request->message,response);
    psVar3 = psVar5 + 1;
  } while ((char)iVar4 == '\0');
  return psVar5 != psVar1;
}

Assistant:

bool session_impl::on_dht_request(string_view query
		, dht::msg const& request, entry& response)
	{
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_ses_extensions[plugins_dht_request_idx])
		{
			if (ext->on_dht_request(query
				, request.addr, request.message, response))
				return true;
		}
#else
		TORRENT_UNUSED(query);
		TORRENT_UNUSED(request);
		TORRENT_UNUSED(response);
#endif
		return false;
	}